

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
::_insert_boundary(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
                   *this,Index currentIndex)

{
  Index *pIVar1;
  pointer pIVar2;
  undefined1 *puVar3;
  node_ptr plVar4;
  uint uVar5;
  pointer p;
  Column_support *pCVar6;
  ulong uVar7;
  Index source;
  anon_class_8_1_8991fb9c get_column_with_pivot_;
  Column *curr;
  bool bVar8;
  initializer_list<unsigned_int> local_38;
  Index local_24;
  
  local_38._M_array = &local_24;
  local_38._M_len = 1;
  uVar5 = (this->mirrorMatrixU_).nextInsertIndex_;
  uVar7 = ((long)(this->mirrorMatrixU_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->mirrorMatrixU_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  local_24 = currentIndex;
  if (uVar7 < uVar5 || uVar7 - uVar5 == 0) {
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>
    ::resize(&(this->mirrorMatrixU_).matrix_,(ulong)(uVar5 + 1));
  }
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>
  ::_container_insert<std::initializer_list<unsigned_int>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>
              *)&this->mirrorMatrixU_,&local_38,uVar5,0);
  pIVar1 = &(this->mirrorMatrixU_).nextInsertIndex_;
  *pIVar1 = *pIVar1 + 1;
  pIVar2 = (this->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar6 = &pIVar2[currentIndex].column_;
  puVar3 = *(undefined1 **)&(pCVar6->super_type).data_;
  uVar5 = 0xffffffff;
  if ((Column_support *)puVar3 != pCVar6 && puVar3 != (undefined1 *)0x0) {
    plVar4 = *(node_ptr *)((long)&pIVar2[currentIndex].column_.super_type + 8);
    if (plVar4 == (node_ptr)0x0) goto LAB_00140fa0;
    uVar5 = *(uint *)&plVar4[1].next_;
  }
  if ((uVar5 != 0xffffffff) &&
     ((ulong)((long)(this->pivotToColumnIndex_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->pivotToColumnIndex_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) <= (ulong)uVar5)) {
    local_38._M_array = (iterator)CONCAT44(local_38._M_array._4_4_,0xffffffff);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->pivotToColumnIndex_,(ulong)(uVar5 * 2 + 2),(value_type_conflict *)&local_38);
  }
  pIVar2 = (this->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar6 = &pIVar2[currentIndex].column_;
  puVar3 = *(undefined1 **)&(pCVar6->super_type).data_;
  if ((Column_support *)puVar3 != pCVar6 && puVar3 != (undefined1 *)0x0) {
    plVar4 = *(node_ptr *)((long)&pIVar2[currentIndex].column_.super_type + 8);
    if (plVar4 == (node_ptr)0x0) {
LAB_00140fa0:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false>>::Matrix_column_tag, Type = 1]"
                   );
    }
    uVar7 = (ulong)*(uint *)&plVar4[1].next_;
    bVar8 = uVar7 == 0xffffffff;
    if (bVar8) {
      source = 0xffffffff;
    }
    else {
      source = (this->pivotToColumnIndex_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
    }
    while (((int)uVar7 != -1 && (source != 0xffffffff))) {
      _reduce_column_by(this,currentIndex,source);
      puVar3 = *(undefined1 **)&(pCVar6->super_type).data_;
      source = 0xffffffff;
      uVar7 = 0xffffffff;
      if ((Column_support *)puVar3 != pCVar6 && puVar3 != (undefined1 *)0x0) {
        plVar4 = *(node_ptr *)((long)&pIVar2[currentIndex].column_.super_type + 8);
        if (plVar4 == (node_ptr)0x0) goto LAB_00140fa0;
        uVar7 = (ulong)*(uint *)&plVar4[1].next_;
      }
      bVar8 = (int)uVar7 == -1;
      if (!bVar8) {
        source = (this->pivotToColumnIndex_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
      }
    }
    if (!bVar8) {
      (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar7] = currentIndex;
    }
  }
  this->nextEventIndex_ = this->nextEventIndex_ + 1;
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_insert_boundary(Index currentIndex)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    mirrorMatrixU_.insert_column({currentIndex});
  } else {
    mirrorMatrixU_.insert_column({{currentIndex, 1}});
  }

  if constexpr (!Master_matrix::Option_list::has_map_column_container) {
    ID_index pivot = reducedMatrixR_.get_column(currentIndex).get_pivot();
    if (pivot != Master_matrix::template get_null_value<ID_index>() && pivotToColumnIndex_.size() <= pivot)
      pivotToColumnIndex_.resize((pivot + 1) * 2, Master_matrix::template get_null_value<Index>());
  }

  _reduce_last_column(currentIndex);
  ++nextEventIndex_;
}